

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O3

gid16 TtfUtil::Cmap310Lookup(void *pCmap310,uint uUnicodeId)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint32 uDiff;
  uint uVar4;
  long lVar5;
  
  uVar4 = *(uint *)((long)pCmap310 + 0xc);
  if (uVar4 != 0) {
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    lVar5 = 0;
    do {
      uVar1 = *(uint *)((long)pCmap310 + lVar5 + 0x10);
      uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8;
      if (((uVar3 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) <= uUnicodeId) &&
         (uVar1 = *(uint *)((long)pCmap310 + lVar5 + 0x14),
         uUnicodeId <=
         (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18))) {
        uVar2 = *(undefined4 *)((long)pCmap310 + lVar5 + 0x18);
        return ((short)uUnicodeId - (short)uVar3) +
               ((ushort)(byte)((uint)uVar2 >> 0x18) | (ushort)((uint)uVar2 >> 8) & 0xff00);
      }
      lVar5 = lVar5 + 0xc;
    } while ((ulong)(uVar4 + (uVar4 == 0)) * 0xc != lVar5);
  }
  return 0;
}

Assistant:

gr::gid16 Cmap310Lookup(const void * pCmap310, unsigned int uUnicodeId)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	//uint32 uLength = read(pTable->length); //could use to test for premature end of table
	uint32 ucGroups = read(pTable->num_groups);

	for (unsigned int i = 0; i < ucGroups; i++)
	{
		uint32 uStartCode = read(pTable->group[i].start_char_code);
		uint32 uEndCode = read(pTable->group[i].end_char_code);
		if (uUnicodeId >= uStartCode && uUnicodeId <= uEndCode)
		{
			uint32 uDiff = uUnicodeId - uStartCode;
			uint32 uStartGid = read(pTable->group[i].start_glyph_id);
			return static_cast<gr::gid16>(uStartGid + uDiff);
		}
	}

	return 0;
}